

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_METAL_CRS(Context *ctx)

{
  size_t in_R8;
  char src1 [64];
  char src0 [64];
  char code [128];
  char acStack_128 [64];
  char local_e8 [64];
  char local_a8 [136];
  
  make_METAL_srcarg_string(ctx,0,7,local_e8,in_R8);
  make_METAL_srcarg_string(ctx,1,7,acStack_128,in_R8);
  ctx->metal_need_header_geometric = 1;
  make_METAL_destarg_assign(ctx,local_a8,0x80,"cross(%s, %s)",local_e8,acStack_128);
  output_line(ctx,"%s",local_a8);
  return;
}

Assistant:

static void emit_METAL_CRS(Context *ctx)
{
    // !!! FIXME: needs to take ctx->dst_arg.writemask into account.
    char src0[64]; make_METAL_srcarg_string_vec3(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_METAL_srcarg_string_vec3(ctx, 1, src1, sizeof (src1));
    char code[128];
    ctx->metal_need_header_geometric = 1;
    make_METAL_destarg_assign(ctx, code, sizeof (code),
                             "cross(%s, %s)", src0, src1);
    output_line(ctx, "%s", code);
}